

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_33808::
ARTCorrectnessTest_Node4DeleteKeyPrefixMerge2_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node4DeleteKeyPrefixMerge2_Test
          (ARTCorrectnessTest_Node4DeleteKeyPrefixMerge2_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node4DeleteKeyPrefixMerge2) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(0x0000000003020102, unodb::test::test_values[0]);
  verifier.insert(0x0000000003030302, unodb::test::test_values[1]);
  verifier.insert(0x0000000100010102, unodb::test::test_values[2]);

  unodb::test::must_not_allocate([&verifier] {
    verifier.remove(0x0000000100010102);
    verifier.remove(0x0000000003020102);
  });

  verifier.check_present_values();
}